

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O2

void av1_cyclic_reset_segment_skip
               (AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize,RUN_TYPE dry_run)

{
  CommonModeInfoParams *mi_params;
  _Bool _Var1;
  ushort uVar2;
  int iVar3;
  MB_MODE_INFO *pMVar4;
  CYCLIC_REFRESH *pCVar5;
  uint8_t *segment_ids;
  uint uVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  BLOCK_SIZE bsize_00;
  ulong uVar10;
  byte bVar11;
  size_t __n;
  uint uVar12;
  uint uVar13;
  int mi_col_00;
  undefined7 in_register_00000081;
  int iVar14;
  bool bVar15;
  
  pMVar4 = *(x->e_mbd).mi;
  uVar2 = *(ushort *)&pMVar4->field_0xa7;
  uVar9 = uVar2 & 7;
  pCVar5 = cpi->cyclic_refresh;
  uVar10 = CONCAT71(in_register_00000081,bsize) & 0xffffffff;
  uVar12 = (cpi->common).mi_params.mi_cols - mi_col;
  if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [uVar10] <= (int)uVar12) {
    uVar12 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [uVar10];
  }
  uVar13 = (cpi->common).mi_params.mi_rows - mi_row;
  if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [uVar10] <= (int)uVar13) {
    uVar13 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [uVar10];
  }
  if (pCVar5->skip_over4x4 != 0) goto LAB_0034163b;
  iVar3 = (x->e_mbd).mi_row;
  iVar14 = (x->e_mbd).mi_col;
  mi_params = &(cpi->common).mi_params;
  segment_ids = ((cpi->common).cur_frame)->seg_map;
  _Var1 = (x->e_mbd).left_available;
  if ((x->e_mbd).up_available == false) {
    if ((_Var1 & 1U) != 0) {
      bVar7 = 0xff;
      bVar8 = 0xff;
      goto LAB_003415df;
    }
    bVar11 = 0;
  }
  else {
    bsize_00 = (BLOCK_SIZE)iVar3 - BLOCK_4X8;
    bVar7 = 0xff;
    mi_col_00 = iVar3;
    if ((_Var1 & 1U) != 0) {
      bVar7 = get_segment_id(mi_params,segment_ids,bsize_00,iVar14 + -1,iVar3);
    }
    bVar8 = get_segment_id(mi_params,segment_ids,bsize_00,iVar14,mi_col_00);
    bVar11 = bVar8;
    if ((_Var1 & 1U) != 0) {
LAB_003415df:
      bVar11 = get_segment_id(mi_params,segment_ids,(BLOCK_SIZE)iVar3,iVar14 + -1,iVar3);
      if ((bVar8 != 0xff) && (bVar7 == bVar8)) {
        bVar11 = bVar8;
      }
    }
  }
  bVar11 = bVar11 & 7;
  *(ushort *)&pMVar4->field_0xa7 = uVar2 & 0xfff8 | (ushort)bVar11;
  if (uVar9 != bVar11) {
    iVar3 = (cpi->common).mi_params.mi_cols;
    __n = (size_t)(int)uVar12;
    uVar6 = 0;
    if (0 < (int)uVar13) {
      uVar6 = uVar13;
    }
    uVar10 = (ulong)uVar6;
    iVar14 = mi_col + mi_row * iVar3;
    while (bVar15 = uVar10 != 0, uVar10 = uVar10 - 1, bVar15) {
      memset(pCVar5->map + iVar14,0,__n);
      memset((cpi->enc_seg).map + iVar14,(uint)bVar11,__n);
      memset(((cpi->common).cur_frame)->seg_map + iVar14,(uint)bVar11,__n);
      iVar14 = iVar14 + iVar3;
    }
  }
LAB_0034163b:
  if (dry_run == '\0') {
    if (uVar9 == 2) {
      x->actual_num_seg2_blocks = x->actual_num_seg2_blocks - uVar13 * uVar12;
    }
    else if (uVar9 == 1) {
      x->actual_num_seg1_blocks = x->actual_num_seg1_blocks - uVar13 * uVar12;
    }
  }
  return;
}

Assistant:

void av1_cyclic_reset_segment_skip(const AV1_COMP *cpi, MACROBLOCK *const x,
                                   int mi_row, int mi_col, BLOCK_SIZE bsize,
                                   RUN_TYPE dry_run) {
  int cdf_num;
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int prev_segment_id = mbmi->segment_id;
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  const int xmis = AOMMIN(cm->mi_params.mi_cols - mi_col, bw);
  const int ymis = AOMMIN(cm->mi_params.mi_rows - mi_row, bh);

  assert(cm->seg.enabled);

  if (!cr->skip_over4x4) {
    mbmi->segment_id =
        av1_get_spatial_seg_pred(cm, xd, &cdf_num, cr->skip_over4x4);
    if (prev_segment_id != mbmi->segment_id) {
      const int block_index = mi_row * cm->mi_params.mi_cols + mi_col;
      const int mi_stride = cm->mi_params.mi_cols;
      const uint8_t segment_id = mbmi->segment_id;
      for (int mi_y = 0; mi_y < ymis; mi_y++) {
        const int map_offset = block_index + mi_y * mi_stride;
        memset(&cr->map[map_offset], 0, xmis);
        memset(&cpi->enc_seg.map[map_offset], segment_id, xmis);
        memset(&cm->cur_frame->seg_map[map_offset], segment_id, xmis);
      }
    }
  }
  if (!dry_run) {
    if (cyclic_refresh_segment_id(prev_segment_id) == CR_SEGMENT_ID_BOOST1)
      x->actual_num_seg1_blocks -= xmis * ymis;
    else if (cyclic_refresh_segment_id(prev_segment_id) == CR_SEGMENT_ID_BOOST2)
      x->actual_num_seg2_blocks -= xmis * ymis;
  }
}